

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distribution.hpp
# Opt level: O3

void mxx::impl::
     distribute_scatter<__gnu_cxx::__normal_iterator<std::array<unsigned_int,4ul>*,std::vector<std::array<unsigned_int,4ul>,std::allocator<std::array<unsigned_int,4ul>>>>,__gnu_cxx::__normal_iterator<std::array<unsigned_int,4ul>*,std::vector<std::array<unsigned_int,4ul>,std::allocator<std::array<unsigned_int,4ul>>>>>
               (__normal_iterator<std::array<unsigned_int,_4UL>_*,_std::vector<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>_>
                begin,__normal_iterator<std::array<unsigned_int,_4UL>_*,_std::vector<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>_>
                      end,
               __normal_iterator<std::array<unsigned_int,_4UL>_*,_std::vector<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>_>
               out,size_t total_size,comm *comm)

{
  int iVar1;
  undefined1 auVar2 [16];
  int iVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  size_t sVar7;
  ulong uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  int root;
  int i;
  pair<unsigned_long,_int> result;
  size_t local_90;
  int local_88;
  custom_op<std::pair<unsigned_long,_int>,_true> local_80;
  int local_40 [4];
  
  sVar7 = (long)end._M_current - (long)begin._M_current >> 4;
  local_88 = comm->m_rank;
  local_90 = sVar7;
  custom_op<std::pair<unsigned_long,int>,true>::
  custom_op<mxx::max_element<unsigned_long>(unsigned_long_const&,mxx::comm_const&)::_lambda(std::pair<unsigned_long,int>const&,std::pair<unsigned_long,int>const&)_1_>
            ((custom_op<std::pair<unsigned_long,int>,true> *)&local_80);
  local_40[0] = 0;
  local_40[1] = 0;
  local_40[2] = 0;
  MPI_Allreduce(&local_90,local_40,1,local_80.m_type_copy,local_80.m_op,comm->mpi_comm);
  custom_op<std::pair<unsigned_long,_int>,_true>::~custom_op(&local_80);
  local_90 = CONCAT44(local_90._4_4_,local_40[2]);
  iVar3 = right_shift<int>((int *)&local_90,comm);
  local_80._vptr_custom_op._0_4_ = (uint)(iVar3 == (int)local_90 || comm->m_rank == 0);
  MPI_Allreduce(&local_80,local_40,1,&ompi_mpi_int,&ompi_mpi_op_land,comm->mpi_comm);
  if (local_40[0] == 0) {
    MPI_Comm_rank(&ompi_mpi_comm_world,&local_80);
    printf("\n[Rank %d] %s:%d: %s: Assertion `%s` failed. Aborting.\n",
           (ulong)(uint)local_80._vptr_custom_op,
           "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/include/mxx/distribution.hpp"
           ,0x41,"distribute_scatter","mxx::all_same(root, comm)");
    fflush(_stdout);
    MPI_Abort(&ompi_mpi_comm_world,0xffffffff);
  }
  iVar3 = comm->m_size;
  uVar8 = (ulong)iVar3;
  iVar1 = comm->m_rank;
  if (iVar1 == (int)local_90) {
    if (sVar7 != total_size) {
      MPI_Comm_rank(&ompi_mpi_comm_world,&local_80);
      printf("\n[Rank %d] %s:%d: %s: Assertion `%s` failed. Aborting.\n",
             (ulong)(uint)local_80._vptr_custom_op,
             "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/include/mxx/distribution.hpp"
             ,0x46,"distribute_scatter","local_size == total_size");
      fflush(_stdout);
      MPI_Abort(&ompi_mpi_comm_world,0xffffffff);
      iVar3 = comm->m_size;
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_80,(long)iVar3,
               (allocator_type *)local_40);
    auVar2 = _DAT_00189030;
    iVar3 = comm->m_size;
    uVar4 = total_size / uVar8;
    uVar8 = total_size % uVar8;
    if (0 < (long)iVar3) {
      lVar5 = (long)iVar3 + -1;
      auVar9._8_4_ = (int)lVar5;
      auVar9._0_8_ = lVar5;
      auVar9._12_4_ = (int)((ulong)lVar5 >> 0x20);
      uVar6 = 0;
      auVar9 = auVar9 ^ _DAT_00189030;
      auVar10 = _DAT_00189020;
      do {
        auVar11 = auVar10 ^ auVar2;
        if ((bool)(~(auVar11._4_4_ == auVar9._4_4_ && auVar9._0_4_ < auVar11._0_4_ ||
                    auVar9._4_4_ < auVar11._4_4_) & 1)) {
          *(ulong *)(CONCAT44(local_80._vptr_custom_op._4_4_,(uint)local_80._vptr_custom_op) +
                    uVar6 * 8) = uVar4 + (uVar6 < uVar8);
        }
        if ((auVar11._12_4_ != auVar9._12_4_ || auVar11._8_4_ <= auVar9._8_4_) &&
            auVar11._12_4_ <= auVar9._12_4_) {
          *(ulong *)(CONCAT44(local_80._vptr_custom_op._4_4_,(uint)local_80._vptr_custom_op) + 8 +
                    uVar6 * 8) = uVar4 + (uVar6 + 1 < uVar8);
        }
        uVar6 = uVar6 + 2;
        lVar5 = auVar10._8_8_;
        auVar10._0_8_ = auVar10._0_8_ + 2;
        auVar10._8_8_ = lVar5 + 2;
      } while ((iVar3 + 1U & 0xfffffffe) != uVar6);
    }
    scatterv<std::array<unsigned_int,4ul>>
              (begin._M_current,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_80,
               out._M_current,uVar4 + ((ulong)(long)iVar1 < uVar8),(int)local_90,comm);
    if ((void *)CONCAT44(local_80._vptr_custom_op._4_4_,(uint)local_80._vptr_custom_op) !=
        (void *)0x0) {
      operator_delete((void *)CONCAT44(local_80._vptr_custom_op._4_4_,(uint)local_80._vptr_custom_op
                                      ));
    }
  }
  else {
    scatterv_recv<std::array<unsigned_int,4ul>>
              (out._M_current,total_size / uVar8 + (ulong)((ulong)(long)iVar1 < total_size % uVar8),
               (int)local_90,comm);
  }
  return;
}

Assistant:

void distribute_scatter(_InIterator begin, _InIterator end, _OutIterator out, size_t total_size, const mxx::comm& comm) {
        size_t local_size = std::distance(begin, end);
        // get root
        std::pair<size_t, int> max_pos = mxx::max_element(local_size, comm);
        int root = max_pos.second;
        MXX_ASSERT(mxx::all_same(root, comm));
        partition::block_decomposition<std::size_t> part(total_size, comm.size(), comm.rank());


        if (comm.rank() == root) {
            MXX_ASSERT(local_size == total_size);
            // use scatterv to send
            std::vector<size_t> send_sizes(comm.size());
            for (int i = 0; i < comm.size(); ++i) {
                send_sizes[i] = part.local_size(i);
            }
            // TODO: scatterv with iterators rather than pointers
            mxx::scatterv(&(*begin), send_sizes, &(*out), part.local_size(), root, comm);
        } else {
            // use scatterv to receive
            size_t recv_size = part.local_size();
            mxx::scatterv_recv(&(*out), recv_size, root, comm);
        }
    }